

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall cmComputeTargetDepends::CollectSideEffects(cmComputeTargetDepends *this)

{
  int depender_index;
  int iVar1;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  
  depender_index = 0;
  std::
  vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
  ::resize(&this->SideEffects,0);
  std::
  vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
  ::resize(&this->SideEffects,
           ((long)(this->InitialGraph).
                  super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)(this->InitialGraph).
                 super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                 super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x18);
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &visited._M_t._M_impl.super__Rb_tree_header._M_header;
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar1 = (int)(((long)(this->InitialGraph).
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                       super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                (long)(this->InitialGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18);
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; iVar1 != depender_index; depender_index = depender_index + 1) {
    CollectSideEffectsForTarget(this,&visited,depender_index);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&visited._M_t);
  return;
}

Assistant:

void cmComputeTargetDepends::CollectSideEffects()
{
  this->SideEffects.resize(0);
  this->SideEffects.resize(this->InitialGraph.size());

  int n = static_cast<int>(this->InitialGraph.size());
  std::set<int> visited;
  for (int i = 0; i < n; ++i) {
    this->CollectSideEffectsForTarget(visited, i);
  }
}